

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<float>::btAlignedObjectArray
          (btAlignedObjectArray<float> *this,btAlignedObjectArray<float> *otherArray)

{
  uint uVar1;
  btAlignedObjectArray<float> *in_RSI;
  btAlignedObjectArray<float> *in_RDI;
  btAlignedObjectArray<float> *unaff_retaddr;
  int otherSize;
  btAlignedObjectArray<float> *this_00;
  btAlignedObjectArray<float> *pbVar2;
  int newsize;
  
  this_00 = in_RSI;
  pbVar2 = in_RDI;
  btAlignedAllocator<float,_16U>::btAlignedAllocator((btAlignedAllocator<float,_16U> *)in_RDI);
  newsize = (int)((ulong)pbVar2 >> 0x20);
  init(in_RDI,(EVP_PKEY_CTX *)in_RSI);
  uVar1 = size(this_00);
  resize(unaff_retaddr,newsize,(float *)this_00);
  copy(this_00,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)uVar1);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}